

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
getfrom_reader::perform(getfrom_reader *this,filesystemcollection *fslist,readercollection *rdlist)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  element_type *peVar4;
  FileReader *__p;
  shared_ptr<ReadWriter> local_68;
  undefined1 local_50 [8];
  ReadWriter_ptr w;
  undefined1 local_30 [8];
  ReadWriter_ptr rd;
  readercollection *rdlist_local;
  filesystemcollection *fslist_local;
  getfrom_reader *this_local;
  
  rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rdlist;
  if (1 < g_verbose) {
    uVar2 = std::__cxx11::string::c_str();
    printf("dogetbytes(%s, %08llx, %08zx)\n",uVar2,this->_ofs,this->_n);
  }
  readercollection::getbyname
            ((readercollection *)local_30,
             (string *)
             rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (!bVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "getfrom: invalid rdname";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  peVar4 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  (*peVar4->_vptr_ReadWriter[4])(peVar4,this->_ofs);
  __p = (FileReader *)operator_new(0x40);
  FileReader::FileReader(__p,&this->_savename);
  std::shared_ptr<ReadWriter>::shared_ptr<FileReader,void>((shared_ptr<ReadWriter> *)local_50,__p);
  peVar4 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  std::shared_ptr<ReadWriter>::shared_ptr(&local_68,(shared_ptr<ReadWriter> *)local_50);
  ReadWriter::copyto<std::shared_ptr<ReadWriter>>(peVar4,&local_68,this->_n);
  std::shared_ptr<ReadWriter>::~shared_ptr(&local_68);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_50);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_30);
  return;
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose>1)
            printf("dogetbytes(%s, %08llx, %08zx)\n", _readername.c_str(), _ofs, _n);

        ReadWriter_ptr rd= rdlist.getbyname(_readername);
        if (!rd) throw "getfrom: invalid rdname";

        rd->setpos(_ofs);

        ReadWriter_ptr w(new FileReader(_savename, FileReader::createnew));

        rd->copyto(w, _n);
    }